

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O0

void objc_end_catch(void)

{
  objc_exception *__ptr;
  thread_data *ptVar1;
  objc_exception *ex;
  _Unwind_Exception *e;
  thread_data *td;
  
  ptVar1 = get_thread_data_fast();
  if (ptVar1->current_exception_type == BOXED_FOREIGN) {
    ptVar1->caughtExceptions = (objc_exception *)0x0;
    ptVar1->current_exception_type = NONE;
  }
  else if (ptVar1->current_exception_type == CXX) {
    __cxa_end_catch();
    ptVar1->current_exception_type = OBJC;
  }
  else if (ptVar1->current_exception_type == FOREIGN) {
    (*(code *)ptVar1->caughtExceptions->landingPad)(1,ptVar1->caughtExceptions);
    ptVar1->current_exception_type = NONE;
    ptVar1->caughtExceptions = (objc_exception *)0x0;
  }
  else {
    if (ptVar1->caughtExceptions == (objc_exception *)0x0) {
      __assert_fail("td->caughtExceptions != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2c3,"void objc_end_catch(void)");
    }
    __ptr = ptVar1->caughtExceptions;
    if (__ptr->catch_count < 0) {
      __ptr->catch_count = __ptr->catch_count + 1;
    }
    else {
      __ptr->catch_count = __ptr->catch_count + -1;
      if (__ptr->catch_count == 0) {
        ptVar1->caughtExceptions = __ptr->next;
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

OBJC_PUBLIC void objc_end_catch(void)
{
	struct thread_data *td = get_thread_data_fast();
	// If this is a boxed foreign exception then the boxing class is
	// responsible for cleaning it up
	if (td->current_exception_type == BOXED_FOREIGN)
	{
		td->caughtExceptions = 0;
		td->current_exception_type = NONE;
		return;
	}
	DEBUG_LOG("Ending catch\n");
	// If this is a C++ exception, then just let the C++ runtime handle it.
	if (td->current_exception_type == CXX)
	{
		__cxa_end_catch();
		td->current_exception_type = OBJC;
		return;
	}
	if (td->current_exception_type == FOREIGN)
	{
		struct _Unwind_Exception *e = ((struct _Unwind_Exception*)td->caughtExceptions);
		e->exception_cleanup(_URC_FOREIGN_EXCEPTION_CAUGHT, e);
		td->current_exception_type = NONE;
		td->caughtExceptions = 0;
		return;
	}
	// Otherwise we should do the cleanup thing.  Nested catches are possible,
	// so we only clean up the exception if this is the last reference.
	assert(td->caughtExceptions != 0);
	struct objc_exception *ex = td->caughtExceptions;
	// If this is being rethrown decrement its (negated) catch count, but don't
	// delete it even if its catch count would be 0.
	if (ex->catch_count < 0)
	{
		ex->catch_count++;
		return;
	}
	ex->catch_count--;
	if (ex->catch_count == 0)
	{
		td->caughtExceptions = ex->next;
		free(ex);
	}
}